

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

string_t duckdb::UncompressedStringStorage::ReadStringWithLength(data_ptr_t target,int32_t offset)

{
  uint uVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  uint *puVar3;
  ulong __n;
  uint *__src;
  uint uStack_c;
  undefined4 uStack_8;
  undefined4 uStack_4;
  
  __src = (uint *)((long)(target + offset) + 4);
  uVar1 = *(uint *)(target + offset);
  __n = (ulong)uVar1;
  if (__n < 0xd) {
    uStack_4 = 0;
    uStack_c = 0;
    uStack_8 = 0;
    puVar3 = (uint *)0x0;
    if (__n != 0) {
      switchD_00b1422a::default(&uStack_c,__src,__n);
      puVar3 = (uint *)CONCAT44(uStack_4,uStack_8);
    }
  }
  else {
    uStack_c = *__src;
    puVar3 = __src;
  }
  uStack_4 = (undefined4)((ulong)puVar3 >> 0x20);
  uStack_8 = SUB84(puVar3,0);
  aVar2._4_1_ = (undefined1)uStack_c;
  aVar2._5_1_ = uStack_c._1_1_;
  aVar2._6_1_ = uStack_c._2_1_;
  aVar2._7_1_ = uStack_c._3_1_;
  aVar2.pointer.length = uVar1;
  aVar2._8_4_ = uStack_8;
  aVar2._12_4_ = uStack_4;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

string_t UncompressedStringStorage::ReadStringWithLength(data_ptr_t target, int32_t offset) {
	auto ptr = target + offset;
	auto str_length = Load<uint32_t>(ptr);
	auto str_ptr = char_ptr_cast(ptr + sizeof(uint32_t));
	return string_t(str_ptr, str_length);
}